

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::deserialize_elems_noinsert<InputStream>
               (undefined8 param_1,undefined4 param_2,undefined8 param_3)

{
  bool bVar1;
  tuple<char,_int> *elem;
  iterator __end0;
  iterator __begin0;
  deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *__range3;
  _Self *in_stack_ffffffffffffff88;
  _Deque_iterator<std::tuple<char,_int>,_std::tuple<char,_int>_&,_std::tuple<char,_int>_*>
  *in_stack_ffffffffffffff90;
  _Deque_iterator<std::tuple<char,_int>,_std::tuple<char,_int>_&,_std::tuple<char,_int>_*> local_48;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  
  local_28 = param_1;
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  std::deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::begin
            ((deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)
             in_stack_ffffffffffffff88);
  std::deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::end
            ((deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)
             in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff90 =
         (_Deque_iterator<std::tuple<char,_int>,_std::tuple<char,_int>_&,_std::tuple<char,_int>_*> *
         )std::
          _Deque_iterator<std::tuple<char,_int>,_std::tuple<char,_int>_&,_std::tuple<char,_int>_*>::
          operator*(&local_48);
    deserialize<std::tuple<char,int>,InputStream>
              ((tuple<char,_int> *)in_stack_ffffffffffffff90,
               (InputStream *)in_stack_ffffffffffffff88);
    std::_Deque_iterator<std::tuple<char,_int>,_std::tuple<char,_int>_&,_std::tuple<char,_int>_*>::
    operator++(in_stack_ffffffffffffff90);
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }